

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinskiplus.h
# Opt level: O3

void ClownLZSS::Internal::KosinskiPlus::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output)

{
  int iVar1;
  char cVar2;
  uchar value;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  
  uVar4 = std::istream::get();
  uVar6 = (ulong)uVar4;
  iVar7 = 8;
  do {
    while( true ) {
      if (iVar7 == 0) {
        uVar4 = std::istream::get();
        uVar6 = (ulong)uVar4;
        iVar7 = 8;
      }
      cVar2 = (char)uVar6;
      uVar6 = uVar6 * 2;
      iVar7 = iVar7 + -1;
      if (-1 < cVar2) break;
      value = std::istream::get();
      DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,_-1>::
      WriteImplementation(output,value);
    }
    if (iVar7 == 0) {
      uVar4 = std::istream::get();
      uVar6 = (ulong)uVar4;
      iVar7 = 8;
    }
    iVar1 = iVar7 + -1;
    uVar4 = std::istream::get();
    if ((char)uVar6 < '\0') {
      bVar3 = std::istream::get();
      uVar8 = 0x2000 - ((uVar4 & 0xf8) << 5 | (uint)bVar3);
      iVar7 = iVar1;
      if ((uVar4 & 7) == 0) {
        bVar3 = std::istream::get();
        if (bVar3 == 0) {
          return;
        }
        uVar5 = bVar3 + 9;
      }
      else {
        uVar5 = 10 - (uVar4 & 7);
      }
    }
    else {
      if (iVar1 == 0) {
        uVar8 = std::istream::get();
        uVar6 = (ulong)((uVar8 & 0xff) + (uVar8 & 0xff));
        uVar5 = (uint)(0x7f < (uVar8 & 0xff)) * 2 + 2;
        iVar7 = 7;
      }
      else {
        uVar5 = (((uint)uVar6 & 0x40) >> 5) + 2;
        iVar7 = iVar7 + -2;
        if (iVar7 == 0) {
          uVar8 = std::istream::get();
          uVar6 = (ulong)uVar8;
          iVar7 = 8;
        }
        else {
          uVar6 = uVar6 << 2;
        }
      }
      uVar8 = 0x100 - (uVar4 & 0xff);
      uVar5 = (uint)(uVar6 >> 7) & 1 | uVar5;
      iVar7 = iVar7 + -1;
    }
    uVar6 = uVar6 * 2;
    DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,_-1>::Copy
              (output,uVar8,uVar5);
  } while( true );
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output)
			{
				BitField<decltype(input)> descriptor_bits(input);

				for (;;)
				{
					if (descriptor_bits.Pop())
					{
						output.Write(input.Read());
					}
					else
					{
						unsigned int offset;
						unsigned int count;

						if (descriptor_bits.Pop())
						{
							const unsigned int high_byte = input.Read();
							const unsigned int low_byte = input.Read();

							offset = ((high_byte & 0xF8) << 5) | low_byte;
							offset = 0x2000 - offset;
							count = high_byte & 7;

							if (count != 0)
							{
								count = 10 - count;
							}
							else
							{
								count = input.Read() + 9;

								if (count == 9)
									break;
							}
						}
						else
						{
							offset = 0x100 - input.Read();

							count = 2;

							if (descriptor_bits.Pop())
								count += 2;
							if (descriptor_bits.Pop())
								count += 1;
						}

						output.Copy(offset, count);
					}
				}
			}